

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

void __thiscall QSpinBox::setPrefix(QSpinBox *this,QString *prefix)

{
  long lVar1;
  QWidget *this_00;
  QString *in_RSI;
  long in_FS_OFFSET;
  QSpinBoxPrivate *d;
  undefined8 local_18;
  QWidgetData *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)d_func((QSpinBox *)0x690bbe);
  QString::operator=((QString *)(this_00 + 0xf),in_RSI);
  (**(code **)((long)*(QSize *)this_00 + 0xc0))();
  QSize::QSize((QSize *)this_00);
  this_00[0x15].data = local_10;
  QSize::QSize((QSize *)this_00);
  *(undefined8 *)(this_00 + 0x16) = local_18;
  QWidget::updateGeometry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpinBox::setPrefix(const QString &prefix)
{
    Q_D(QSpinBox);

    d->prefix = prefix;
    d->updateEdit();

    d->cachedSizeHint = QSize();
    d->cachedMinimumSizeHint = QSize(); // minimumSizeHint cares about the prefix
    updateGeometry();
}